

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
          (SmallVector<slang::analysis::DataFlowState,_2UL> *this,Base *other)

{
  bool bVar1;
  move_iterator<slang::analysis::DataFlowState_*> last;
  move_iterator<slang::analysis::DataFlowState_*> this_00;
  DataFlowState *pDVar2;
  unsigned_long uVar3;
  move_iterator<slang::analysis::DataFlowState_*> in_RSI;
  SmallVectorBase<slang::analysis::DataFlowState> *in_RDI;
  DataFlowState *in_stack_ffffffffffffff98;
  SmallVectorBase<slang::analysis::DataFlowState> *in_stack_ffffffffffffffa0;
  
  SmallVectorBase<slang::analysis::DataFlowState>::SmallVectorBase(in_RDI);
  bVar1 = SmallVectorBase<slang::analysis::DataFlowState>::isSmall
                    ((SmallVectorBase<slang::analysis::DataFlowState> *)in_RSI._M_current);
  if (bVar1) {
    in_RDI->cap = 2;
    SmallVectorBase<slang::analysis::DataFlowState>::begin
              ((SmallVectorBase<slang::analysis::DataFlowState> *)in_RSI._M_current);
    last = std::make_move_iterator<slang::analysis::DataFlowState*>(in_stack_ffffffffffffff98);
    SmallVectorBase<slang::analysis::DataFlowState>::end
              ((SmallVectorBase<slang::analysis::DataFlowState> *)in_RSI._M_current);
    this_00 = std::make_move_iterator<slang::analysis::DataFlowState*>(in_stack_ffffffffffffff98);
    SmallVectorBase<slang::analysis::DataFlowState>::
    append<std::move_iterator<slang::analysis::DataFlowState_*>_>
              ((SmallVectorBase<slang::analysis::DataFlowState> *)this_00._M_current,in_RSI,last);
    SmallVectorBase<slang::analysis::DataFlowState>::clear(in_stack_ffffffffffffffa0);
  }
  else {
    pDVar2 = std::exchange<slang::analysis::DataFlowState*,decltype(nullptr)>
                       (&in_stack_ffffffffffffffa0->data_,(void **)in_stack_ffffffffffffff98);
    in_RDI->data_ = pDVar2;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->len = uVar3;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->cap = uVar3;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }